

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_cfi_beginCIE(sysbvm_dwarf_cfi_builder_t *cfi,sysbvm_dwarf_cie_t *cie)

{
  undefined7 uVar1;
  size_t sVar2;
  uint32_t value;
  char *cstring;
  sysbvm_dwarf_cie_t *cie_local;
  sysbvm_dwarf_cfi_builder_t *cfi_local;
  
  sVar2 = sysbvm_dwarf_encodeDWord(&cfi->buffer,0);
  cfi->cieOffset = sVar2;
  value = 0xffffffff;
  if ((cfi->isEhFrame & 1U) != 0) {
    value = 0;
  }
  sVar2 = sysbvm_dwarf_encodeDwarfPointer(&cfi->buffer,value);
  cfi->cieContentOffset = sVar2;
  uVar1 = *(undefined7 *)&cie->field_0x1;
  (cfi->cie).pointerSize = cie->pointerSize;
  *(undefined7 *)&(cfi->cie).field_0x1 = uVar1;
  (cfi->cie).codeAlignmentFactor = cie->codeAlignmentFactor;
  (cfi->cie).dataAlignmentFactor = cie->dataAlignmentFactor;
  (cfi->cie).returnAddressRegister = cie->returnAddressRegister;
  sysbvm_dwarf_encodeByte(&cfi->buffer,cfi->version);
  cstring = "";
  if ((cfi->isEhFrame & 1U) != 0) {
    cstring = "zR";
  }
  sysbvm_dwarf_encodeCString(&cfi->buffer,cstring);
  if ((cfi->isEhFrame & 1U) == 0) {
    sysbvm_dwarf_encodeByte(&cfi->buffer,'\b');
    sysbvm_dwarf_encodeByte(&cfi->buffer,'\0');
  }
  sysbvm_dwarf_encodeULEB128(&cfi->buffer,cie->codeAlignmentFactor);
  sysbvm_dwarf_encodeSLEB128(&cfi->buffer,cie->dataAlignmentFactor);
  if ((cfi->version < 3) && ((cfi->isEhFrame & 1U) == 0)) {
    sysbvm_dwarf_encodeByte(&cfi->buffer,(uint8_t)cie->returnAddressRegister);
  }
  else {
    sysbvm_dwarf_encodeULEB128(&cfi->buffer,cie->returnAddressRegister);
  }
  if ((cfi->isEhFrame & 1U) != 0) {
    sysbvm_dwarf_encodeULEB128(&cfi->buffer,1);
    sysbvm_dwarf_encodeByte(&cfi->buffer,'\x1b');
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_beginCIE(sysbvm_dwarf_cfi_builder_t *cfi, sysbvm_dwarf_cie_t *cie)
{
    cfi->cieOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
    cfi->cieContentOffset = sysbvm_dwarf_encodeDwarfPointer(&cfi->buffer, cfi->isEhFrame ? 0 : -1 ); // CIE_id
    cfi->cie = *cie;
    sysbvm_dwarf_encodeByte(&cfi->buffer, cfi->version);
    sysbvm_dwarf_encodeCString(&cfi->buffer, cfi->isEhFrame ? "zR" : ""); // Argumentation
    if(!cfi->isEhFrame)
    {
        sysbvm_dwarf_encodeByte(&cfi->buffer, sizeof(uintptr_t)); // Address size
        sysbvm_dwarf_encodeByte(&cfi->buffer, 0); // Segment size
    }
    sysbvm_dwarf_encodeULEB128(&cfi->buffer, cie->codeAlignmentFactor);
    sysbvm_dwarf_encodeSLEB128(&cfi->buffer, cie->dataAlignmentFactor);
    if(cfi->version <= 2 && !cfi->isEhFrame)
        sysbvm_dwarf_encodeByte(&cfi->buffer, (uint8_t)cie->returnAddressRegister);
    else
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, cie->returnAddressRegister);
    if(cfi->isEhFrame)
    {
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, 1);
        sysbvm_dwarf_encodeByte(&cfi->buffer, DW_EH_PE_pcrel | DW_EH_PE_sdata4);
    }
}